

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O1

_matrix<float> * __thiscall
xray_re::_matrix<float>::invert_43(_matrix<float> *this,_matrix<float> *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (a->field_0).field_0._21;
  fVar4 = (a->field_0).field_0._22;
  fVar2 = (a->field_0).field_0._33;
  fVar5 = (a->field_0).field_0._23;
  fVar6 = (a->field_0).field_0._32;
  fVar3 = fVar4 * fVar2 - fVar6 * fVar5;
  fVar7 = (a->field_0).field_0._31;
  fVar2 = fVar2 * fVar1 - fVar5 * fVar7;
  fVar1 = fVar1 * fVar6 - fVar7 * fVar4;
  fVar4 = (a->field_0).field_0._13 * fVar1 +
          ((a->field_0).field_0._11 * fVar3 - (a->field_0).field_0._12 * fVar2);
  if (1e-07 <= (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                      (uint)(0.0 - fVar4) & -(uint)(fVar4 < 0.0))) {
    fVar3 = fVar3 / fVar4;
    (this->field_0).field_0._11 = fVar3;
    fVar2 = -fVar2 / fVar4;
    (this->field_0).field_0._21 = fVar2;
    fVar1 = fVar1 / fVar4;
    (this->field_0).field_0._31 = fVar1;
    fVar5 = -((a->field_0).field_0._12 * (a->field_0).field_0._33 -
             (a->field_0).field_0._32 * (a->field_0).field_0._13) / fVar4;
    (this->field_0).field_0._12 = fVar5;
    fVar6 = ((a->field_0).field_0._12 * (a->field_0).field_0._23 -
            (a->field_0).field_0._22 * (a->field_0).field_0._13) / fVar4;
    (this->field_0).field_0._13 = fVar6;
    (this->field_0).field_0._14 = 0.0;
    fVar7 = ((a->field_0).field_0._11 * (a->field_0).field_0._33 -
            (a->field_0).field_0._31 * (a->field_0).field_0._13) / fVar4;
    (this->field_0).field_0._22 = fVar7;
    fVar8 = -((a->field_0).field_0._11 * (a->field_0).field_0._23 -
             (a->field_0).field_0._21 * (a->field_0).field_0._13) / fVar4;
    (this->field_0).field_0._23 = fVar8;
    (this->field_0).field_0._24 = 0.0;
    fVar9 = -((a->field_0).field_0._11 * (a->field_0).field_0._32 -
             (a->field_0).field_0._31 * (a->field_0).field_0._12) / fVar4;
    (this->field_0).field_0._32 = fVar9;
    fVar4 = ((a->field_0).field_0._11 * (a->field_0).field_0._22 -
            (a->field_0).field_0._21 * (a->field_0).field_0._12) / fVar4;
    (this->field_0).field_0._33 = fVar4;
    (this->field_0).field_0._34 = 0.0;
    (this->field_0).field_0._41 =
         -(fVar1 * (a->field_0).field_0._43 +
          fVar3 * (a->field_0).field_0._41 + fVar2 * (a->field_0).field_0._42);
    (this->field_0).field_0._42 =
         -(fVar9 * (a->field_0).field_0._43 +
          fVar5 * (a->field_0).field_0._41 + fVar7 * (a->field_0).field_0._42);
    (this->field_0).field_0._43 =
         -(fVar4 * (a->field_0).field_0._43 +
          fVar6 * (a->field_0).field_0._41 + fVar8 * (a->field_0).field_0._42);
    (this->field_0).field_0._44 = 1.0;
    return this;
  }
  __assert_fail("!equivalent<T>(det, 0, 0.0000001f)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_matrix.h"
                ,0x126,
                "_matrix<T> &xray_re::_matrix<float>::invert_43(const _matrix<T> &) [T = float]");
}

Assistant:

_matrix<T>& _matrix<T>::invert_43(const _matrix<T>& a)
{
	T cf1 = a._22*a._33 - a._23*a._32;
	T cf2 = a._21*a._33 - a._23*a._31;
	T cf3 = a._21*a._32 - a._22*a._31;

	T det = a._11*cf1 - a._12*cf2 + a._13*cf3;
	
	//xr_assert(!equivalent<T>(det, 0));
	// 1850 xform asserted
	xr_assert(!equivalent<T>(det, 0, 0.0000001f));

	_11 = cf1/det;
	_21 =-cf2/det;
	_31 = cf3/det;

//	_11 = (a._22*a._33 - a._23*a._32)/det;
	_12 =-(a._12*a._33 - a._13*a._32)/det;
	_13 = (a._12*a._23 - a._13*a._22)/det;
	_14 = 0;

//	_21 =-(a._21*a._33 - a._23*a._31)/det;
	_22 = (a._11*a._33 - a._13*a._31)/det;
	_23 =-(a._11*a._23 - a._13*a._21)/det;
	_24 = 0;

//	_31 = (a._21*a._32 - a._22*a._31)/det;
	_32 =-(a._11*a._32 - a._12*a._31)/det;
	_33 = (a._11*a._22 - a._12*a._21)/det;
	_34 = 0;

	_41 =-(a._41*_11 + a._42*_21 + a._43*_31);
	_42 =-(a._41*_12 + a._42*_22 + a._43*_32);
	_43 =-(a._41*_13 + a._42*_23 + a._43*_33);
	_44 = 1;

	return *this;
}